

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

VarStatus __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::basisColStatus(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int col)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  VarStatus VVar4;
  VarStatus *pVVar5;
  int in_ESI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  undefined4 in_stack_fffffffffffffec8;
  int col_00;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffed8;
  
  if ((in_ESI < 0) ||
     (col_00 = in_ESI,
     iVar3 = numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x7b73e2), iVar3 <= col_00)) {
    return ZERO;
  }
  bVar1 = hasBasis(in_RDI);
  if (bVar1) {
    if ((in_RDI->_isRealLPLoaded & 1U) != 0) {
      VVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBasisColStatus((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_RDI,col_00);
      return VVar4;
    }
    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](&in_RDI->_basisStatusCols,in_ESI);
    return *pVVar5;
  }
  lowerReal(in_stack_fffffffffffffed8,(int)((ulong)in_RDI >> 0x20));
  realParam(in_RDI,INFTY);
  tVar2 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(col_00,in_stack_fffffffffffffec8),(double *)0x7b746b);
  if (!tVar2) {
    upperReal(in_stack_fffffffffffffed8,(int)((ulong)in_RDI >> 0x20));
    realParam(in_RDI,INFTY);
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(col_00,in_stack_fffffffffffffec8),(double *)0x7b74bb);
    if (!tVar2) {
      return ZERO;
    }
    return ON_UPPER;
  }
  return ON_LOWER;
}

Assistant:

typename SPxSolverBase<R>::VarStatus SoPlexBase<R>::basisColStatus(int col) const
{
   assert(col >= 0);
   assert(col < numCols());

   // if index is out of range, return nonbasic status as for a newly added unbounded column
   if(col < 0 || col >= numCols())
   {
      return SPxSolverBase<R>::ZERO;
   }
   // if no basis is available, return slack basis
   else if(!hasBasis())
   {
      if(lowerReal(col) > -realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_LOWER;
      else if(upperReal(col) < realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_UPPER;
      else
         return SPxSolverBase<R>::ZERO;
   }
   // if the real LP is loaded, ask solver
   else if(_isRealLPLoaded)
   {
      return _solver.getBasisColStatus(col);
   }
   // if the real LP is not loaded, the basis is stored in the basis arrays of this class
   else
   {
      assert(col < _basisStatusCols.size());
      return _basisStatusCols[col];
   }
}